

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  size_t *in_RDX;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  ulong uVar7;
  size_t length;
  long in_FS_OFFSET;
  undefined1 local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  length = *in_RDX;
  uVar7 = in_RDX[1];
  this->dest_ = (WritableFile *)0x0;
  bVar4 = true;
  do {
    iVar3 = (int)slice->size_;
    if (0x8000 < iVar3) {
      __assertion = "leftover >= 0";
      uVar1 = 0x2d;
LAB_005386d8:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                    ,uVar1,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (0x7ff9 < iVar3) {
      if (iVar3 != 0x8000) {
        local_50._8_8_ = ZEXT48(0x8000 - iVar3);
        local_50._0_8_ = "";
        (**(code **)(*(long *)slice->data_ + 0x10))
                  ((Status *)(local_50 + 0x10),slice->data_,(Writer *)local_50);
        Status::~Status((Status *)(local_50 + 0x10));
      }
      *(undefined4 *)&slice->size_ = 0;
      iVar3 = 0;
    }
    if ((int)(0x7ff9U - iVar3) < 0) {
      __assertion = "kBlockSize - block_offset_ - kHeaderSize >= 0";
      uVar1 = 0x39;
      goto LAB_005386d8;
    }
    uVar5 = (ulong)(0x7ff9U - iVar3);
    uVar6 = uVar5;
    if (uVar7 < uVar5) {
      uVar6 = uVar7;
    }
    uVar1 = (uVar5 < uVar7) + 1;
    if (!bVar4) {
      uVar1 = 4 - (uVar5 < uVar7);
    }
    EmitPhysicalRecord((Writer *)local_50,(RecordType)slice,(char *)(ulong)uVar1,length);
    uVar2 = local_50._0_8_;
    this->dest_ = (WritableFile *)local_50._0_8_;
    local_50._0_8_ = (WritableFile *)0x0;
    Status::~Status((Status *)local_50);
    if ((WritableFile *)uVar2 != (WritableFile *)0x0) break;
    length = length + uVar6;
    bVar4 = false;
    uVar7 = uVar7 - uVar6;
  } while (uVar7 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}